

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::ExternalParser::ProcessLine(ExternalParser *this)

{
  bool bVar1;
  string local_30;
  ExternalParser *local_10;
  ExternalParser *this_local;
  
  local_10 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexExternal,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexExternal,1);
    DoPath(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return true;
}

Assistant:

bool ProcessLine()
    {
    if(this->RegexExternal.find(this->Line))
      {
      this->DoPath(this->RegexExternal.match(1));
      }
    return true;
    }